

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::a64::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  bool bVar1;
  RegGroup RVar2;
  RegGroup RVar3;
  uint32_t uVar4;
  uint32_t id;
  Error EVar5;
  FuncDetail *this_00;
  InvokeNode *invokeNode_00;
  BaseNode *node;
  InvokeNode *invokeNode_01;
  BaseRAPass *this_01;
  Operand_ *pOVar6;
  Operand *pOVar7;
  BaseBuilder *this_02;
  FuncValue *this_03;
  FuncNode *pFVar8;
  FuncFrame *this_04;
  InvokeNode *in_RSI;
  RACFGBuilder *in_RDI;
  RegGroup retGroup;
  RegGroup regGroup_1;
  Error _err_4;
  RAWorkReg *workReg_1;
  Reg *reg_2;
  Operand *op_1;
  FuncValue *ret;
  uint32_t valueIndex_1;
  Error _err_3;
  Error _err_2;
  BaseReg reg_1;
  Error _err_1;
  RegGroup argGroup;
  RegGroup regGroup;
  Error _err;
  RAWorkReg *workReg;
  Reg *reg;
  Operand *op;
  FuncValue *arg;
  uint32_t valueIndex;
  FuncValuePack *argPack;
  uint32_t argIndex;
  uint32_t argCount;
  FuncDetail *fd;
  undefined4 in_stack_fffffffffffffef8;
  FuncAttributes in_stack_fffffffffffffefc;
  InvokeNode *in_stack_ffffffffffffff00;
  RAWorkReg **in_stack_ffffffffffffff08;
  BaseRAPass *pBVar9;
  InvokeNode *in_stack_ffffffffffffff10;
  BaseRAPass *in_stack_ffffffffffffff18;
  InvokeNode *in_stack_ffffffffffffff20;
  BaseRAPass *in_stack_ffffffffffffff28;
  BaseRAPass *reg_00;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined4 in_stack_ffffffffffffff5c;
  uint local_80;
  undefined8 local_74;
  undefined8 local_6c;
  uint local_34;
  uint local_28;
  
  this_00 = InvokeNode::detail(in_RSI);
  uVar4 = InvokeNode::argCount((InvokeNode *)0x171266);
  invokeNode_00 = (InvokeNode *)cc(in_RDI);
  node = BaseNode::prev((BaseNode *)in_RSI);
  BaseBuilder::_setCursor((BaseBuilder *)invokeNode_00,node);
  for (local_28 = 0; local_28 < uVar4; local_28 = local_28 + 1) {
    FuncDetail::argPack((FuncDetail *)in_stack_ffffffffffffff00,
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      invokeNode_01 =
           (InvokeNode *)
           FuncValuePack::operator[]
                     ((FuncValuePack *)in_stack_ffffffffffffff00,
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar1 = FuncValue::operator_cast_to_bool((FuncValue *)invokeNode_01);
      if (!bVar1) break;
      this_01 = (BaseRAPass *)
                FuncValuePack::operator[]
                          ((FuncValuePack *)in_stack_ffffffffffffff00,
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pBVar9 = this_01;
      pOVar6 = &InvokeNode::arg(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                                (size_t)in_stack_ffffffffffffff00)->super_Operand_;
      bVar1 = Operand_::isNone((Operand_ *)in_stack_ffffffffffffff00);
      if (!bVar1) {
        bVar1 = Operand_::isReg((Operand_ *)0x171392);
        if (bVar1) {
          pOVar6 = (Operand_ *)Operand_::as<asmjit::_abi_1_10::arm::Reg>(pOVar6);
          reg_00 = (in_RDI->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
          id = Operand_::id(pOVar6);
          Operand_::virtIdToIndex(id);
          EVar5 = BaseRAPass::virtIndexAsWorkReg
                            (in_stack_ffffffffffffff18,
                             (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                             in_stack_ffffffffffffff08);
          if (EVar5 != 0) {
            return EVar5;
          }
          bVar1 = FuncValue::isReg((FuncValue *)0x171425);
          if (bVar1) {
            RVar2 = RAWorkReg::group((RAWorkReg *)0x171438);
            FuncValue::regType((FuncValue *)this_01);
            RVar3 = arm::Reg::groupOf(kNone);
            if (RVar2 != RVar3) {
              EVar5 = DebugUtils::errored(0x19);
              return EVar5;
            }
          }
          else {
            EVar5 = moveRegToStackArg(in_RDI,invokeNode_01,(FuncValue *)pBVar9,(BaseReg *)reg_00);
joined_r0x001714bf:
            if (EVar5 != 0) {
              return EVar5;
            }
          }
        }
        else {
          bVar1 = Operand_::isImm((Operand_ *)0x1714ee);
          if (bVar1) {
            bVar1 = FuncValue::isReg((FuncValue *)0x171504);
            if (!bVar1) {
              in_stack_ffffffffffffff10 = in_RSI;
              Operand_::as<asmjit::_abi_1_10::Imm>(pOVar6);
              EVar5 = moveImmToStackArg((RACFGBuilder *)in_stack_ffffffffffffff28,
                                        in_stack_ffffffffffffff20,(FuncValue *)this_01,
                                        (Imm *)in_stack_ffffffffffffff10);
              in_stack_ffffffffffffff18 = this_01;
              goto joined_r0x001714bf;
            }
            BaseReg::BaseReg((BaseReg *)in_stack_ffffffffffffff00);
            in_stack_ffffffffffffff20 = in_RSI;
            Operand_::as<asmjit::_abi_1_10::Imm>(pOVar6);
            EVar5 = moveImmToRegArg((RACFGBuilder *)
                                    CONCAT44(in_stack_ffffffffffffff5c,
                                             CONCAT13(in_stack_ffffffffffffff5b,
                                                      CONCAT12(in_stack_ffffffffffffff5a,
                                                               in_stack_ffffffffffffff58))),
                                    invokeNode_00,(FuncValue *)in_RDI,(Imm *)invokeNode_01,
                                    (BaseReg *)pBVar9);
            if (EVar5 != 0) {
              return EVar5;
            }
            pOVar7 = InvokeNode::OperandPack::operator[]
                               ((OperandPack *)in_stack_ffffffffffffff00,
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            (pOVar7->super_Operand_)._signature = (Signature)(undefined4)local_74;
            (pOVar7->super_Operand_)._baseId = local_74._4_4_;
            *(undefined8 *)(pOVar7->super_Operand_)._data = local_6c;
            in_stack_ffffffffffffff28 = this_01;
          }
        }
      }
    }
  }
  this_02 = (BaseBuilder *)cc(in_RDI);
  BaseBuilder::_setCursor(this_02,(BaseNode *)in_RSI);
  bVar1 = FuncDetail::hasRet((FuncDetail *)in_stack_ffffffffffffff00);
  if (bVar1) {
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      this_03 = FuncDetail::ret((FuncDetail *)in_stack_ffffffffffffff00,
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar1 = FuncValue::operator_cast_to_bool(this_03);
      if (!bVar1) break;
      pOVar6 = &InvokeNode::ret(in_stack_ffffffffffffff00,
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))->
                super_Operand_;
      bVar1 = Operand_::isReg((Operand_ *)0x171722);
      if (bVar1) {
        pOVar6 = (Operand_ *)Operand_::as<asmjit::_abi_1_10::arm::Reg>(pOVar6);
        pBVar9 = (in_RDI->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
        uVar4 = Operand_::id(pOVar6);
        Operand_::virtIdToIndex(uVar4);
        EVar5 = BaseRAPass::virtIndexAsWorkReg
                          (in_stack_ffffffffffffff18,
                           (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),(RAWorkReg **)pBVar9
                          );
        if (EVar5 != 0) {
          return EVar5;
        }
        bVar1 = FuncValue::isReg((FuncValue *)0x1717a0);
        if (bVar1) {
          RVar2 = RAWorkReg::group((RAWorkReg *)0x1717b0);
          FuncValue::regType(this_03);
          RVar3 = arm::Reg::groupOf(kNone);
          if (RVar2 != RVar3) {
            EVar5 = DebugUtils::errored(0x19);
            return EVar5;
          }
        }
      }
    }
  }
  RABlock::addFlags((RABlock *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  pFVar8 = BaseRAPass::func((in_RDI->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                            _pass);
  FuncNode::frame(pFVar8);
  FuncFrame::addAttributes((FuncFrame *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  pFVar8 = BaseRAPass::func((in_RDI->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                            _pass);
  this_04 = FuncNode::frame(pFVar8);
  FuncDetail::argStackSize(this_00);
  FuncFrame::updateCallStackSize(this_04,in_stack_fffffffffffffefc);
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup != argGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
        else {
          ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup retGroup = Reg::groupOf(ret.regType());

          if (regGroup != retGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}